

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt_callback.cpp
# Opt level: O3

void __thiscall OmptInterface::target_data_exit_end(OmptInterface *this,int64_t device_id)

{
  ompt_callback_target_t p_Var1;
  ompt_data_t *poVar2;
  ompt_id_t *poVar3;
  
  p_Var1 = ompt_callback_target_fn;
  if ((ompt_callback_target_fn != (ompt_callback_target_t)0x0 & ompt_enabled) == 1) {
    poVar2 = (*ompt_get_task_data_fn)();
    poVar3 = (ompt_id_t *)__tls_get_addr(&PTR_0010ff80);
    (*p_Var1)(ompt_target_exit_data,ompt_scope_end,(int)device_id,poVar2,*poVar3,this->_codeptr_ra);
    if (ompt_enabled == 0) {
      return;
    }
  }
  else {
    if (ompt_enabled == 0) {
      return;
    }
    poVar3 = (ompt_id_t *)__tls_get_addr(&PTR_0010ff80);
  }
  *poVar3 = 0;
  return;
}

Assistant:

void OmptInterface::target_data_exit_end(int64_t device_id) {
  OMPT_CALLBACK(ompt_callback_target_fn, 
    (ompt_target_exit_data, 
     ompt_scope_end,
     device_id,
     ompt_get_task_data_fn(), 
     ompt_target_region_id, 
     _codeptr_ra
    )); 
  target_region_end();
}